

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

void av1_setup_frame_sign_bias(AV1_COMMON *cm)

{
  SequenceHeader *pSVar1;
  long lVar2;
  uint uVar3;
  RefCntBuffer *pRVar4;
  uint uVar5;
  
  pSVar1 = cm->seq_params;
  lVar2 = 0;
  do {
    if ((long)cm->remapped_ref_idx[lVar2] == -1) {
      pRVar4 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar4 = cm->ref_frame_map[cm->remapped_ref_idx[lVar2]];
    }
    uVar3 = 0;
    if (((pSVar1->order_hint_info).enable_order_hint != 0) && (pRVar4 != (RefCntBuffer *)0x0)) {
      uVar5 = 1 << ((byte)(pSVar1->order_hint_info).order_hint_bits_minus_1 & 0x1f);
      uVar3 = pRVar4->order_hint - (cm->current_frame).order_hint;
      uVar3 = (uint)((int)(uVar5 & uVar3) < (int)(uVar5 - 1 & uVar3));
    }
    cm->ref_frame_sign_bias[lVar2 + 1] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  return;
}

Assistant:

void av1_setup_frame_sign_bias(AV1_COMMON *cm) {
  MV_REFERENCE_FRAME ref_frame;
  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    if (cm->seq_params->order_hint_info.enable_order_hint && buf != NULL) {
      const int ref_order_hint = buf->order_hint;
      cm->ref_frame_sign_bias[ref_frame] =
          (get_relative_dist(&cm->seq_params->order_hint_info, ref_order_hint,
                             (int)cm->current_frame.order_hint) <= 0)
              ? 0
              : 1;
    } else {
      cm->ref_frame_sign_bias[ref_frame] = 0;
    }
  }
}